

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::perturbMaxEnter(SPxSolverBase<double> *this)

{
  UpdateVector<double> *uvec;
  double eps;
  double p_delta;
  
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SSVectorBase<double>::setup(&this->theFvec->thedelta);
  uvec = this->theFvec;
  eps = epsilon(this);
  p_delta = entertol(this);
  perturbMax(this,uvec,&this->theLBbound,&this->theUBbound,eps,p_delta,0,1);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMaxEnter(void)
{
   SPxOut::debug(this, "DSHIFT04 iteration= {} perturbing {}", this->iteration(), shift());
   fVec().delta().setup();
   perturbMax(fVec(), lbBound(), ubBound(), epsilon(), entertol());
   SPxOut::debug(this, "\t->{}\n", shift());
}